

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_validator_factory_202012.hpp
# Opt level: O3

schema_validator_ptr_type __thiscall
jsoncons::jsonschema::draft202012::
schema_validator_factory_202012<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
::make_schema_validator
          (schema_validator_factory_202012<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
           *this,compilation_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                 *context,basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *sch,
          span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_18446744073709551615UL>
          keys,anchor_uri_map_type *anchor_dict)

{
  json_type jVar1;
  runtime_error *this_00;
  uri_wrapper *uri;
  pointer puVar2;
  compilation_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
  new_context;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a0;
  undefined1 local_280 [160];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1e0 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_160;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_150;
  vector<jsoncons::jsonschema::uri_wrapper,_std::allocator<jsoncons::jsonschema::uri_wrapper>_>
  local_138;
  __buckets_ptr local_120;
  __node_base local_110 [16];
  char local_90;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  (**(code **)((context->base_uri_).uri_.uri_string_._M_dataplus._M_p + 0x10))(local_280 + 0x90);
  jVar1 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::type
                    ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)keys.data_)
  ;
  if (jVar1 == bool_value) {
    schema_validator_factory_base<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
    ::make_boolean_schema
              ((schema_validator_factory_base<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                *)local_280,context,
               (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
               (local_280 + 0x90));
    (this->
    super_schema_validator_factory_base<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
    )._vptr_schema_validator_factory_base = (_func_int **)local_280._0_8_;
    if (local_138.
        super__Vector_base<jsoncons::jsonschema::uri_wrapper,_std::allocator<jsoncons::jsonschema::uri_wrapper>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_138.
        super__Vector_base<jsoncons::jsonschema::uri_wrapper,_std::allocator<jsoncons::jsonschema::uri_wrapper>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      puVar2 = local_138.
               super__Vector_base<jsoncons::jsonschema::uri_wrapper,_std::allocator<jsoncons::jsonschema::uri_wrapper>_>
               ._M_impl.super__Vector_impl_data._M_start;
      do {
        std::
        _Rb_tree<jsoncons::uri,std::pair<jsoncons::uri_const,jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>*>,std::_Select1st<std::pair<jsoncons::uri_const,jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>*>>,std::less<jsoncons::uri>,std::allocator<std::pair<jsoncons::uri_const,jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>*>>>
        ::
        _M_emplace_unique<jsoncons::uri_const&,jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>*&>
                  ((_Rb_tree<jsoncons::uri,std::pair<jsoncons::uri_const,jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>*>,std::_Select1st<std::pair<jsoncons::uri_const,jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>*>>,std::less<jsoncons::uri>,std::allocator<std::pair<jsoncons::uri_const,jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>*>>>
                    *)(context->base_uri_).identifier_.field_2._M_allocated_capacity,&puVar2->uri_,
                   (schema_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                    **)local_280);
        puVar2 = puVar2 + 1;
      } while (puVar2 != local_138.
                         super__Vector_base<jsoncons::jsonschema::uri_wrapper,_std::allocator<jsoncons::jsonschema::uri_wrapper>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
    }
  }
  else {
    if (jVar1 != object_value) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x18);
      compilation_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
      ::get_base_uri((uri *)local_280,
                     (compilation_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                      *)(local_280 + 0x90));
      std::operator+(&local_2a0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_280,
                     ": Invalid JSON-type for a schema, expected: boolean or object");
      *(undefined ***)(this_00 + 0x10) = &PTR__json_exception_00b2f248;
      std::runtime_error::runtime_error(this_00,(string *)&local_2a0);
      *(undefined8 *)this_00 = 0xb40ec8;
      *(undefined8 *)(this_00 + 0x10) = 0xb40f00;
      __cxa_throw(this_00,&schema_error::typeinfo,schema_error::~schema_error);
    }
    make_object_schema_validator
              ((schema_validator_factory_202012<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                *)local_280,context,
               (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
               (local_280 + 0x90),(anchor_uri_map_type *)keys.data_);
    (this->
    super_schema_validator_factory_base<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
    )._vptr_schema_validator_factory_base = (_func_int **)local_280._0_8_;
    if (local_138.
        super__Vector_base<jsoncons::jsonschema::uri_wrapper,_std::allocator<jsoncons::jsonschema::uri_wrapper>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_138.
        super__Vector_base<jsoncons::jsonschema::uri_wrapper,_std::allocator<jsoncons::jsonschema::uri_wrapper>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      puVar2 = local_138.
               super__Vector_base<jsoncons::jsonschema::uri_wrapper,_std::allocator<jsoncons::jsonschema::uri_wrapper>_>
               ._M_impl.super__Vector_impl_data._M_start;
      do {
        std::
        _Rb_tree<jsoncons::uri,std::pair<jsoncons::uri_const,jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>*>,std::_Select1st<std::pair<jsoncons::uri_const,jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>*>>,std::less<jsoncons::uri>,std::allocator<std::pair<jsoncons::uri_const,jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>*>>>
        ::
        _M_emplace_unique<jsoncons::uri_const&,jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>*&>
                  ((_Rb_tree<jsoncons::uri,std::pair<jsoncons::uri_const,jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>*>,std::_Select1st<std::pair<jsoncons::uri_const,jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>*>>,std::less<jsoncons::uri>,std::allocator<std::pair<jsoncons::uri_const,jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>*>>>
                    *)(context->base_uri_).identifier_.field_2._M_allocated_capacity,&puVar2->uri_,
                   (schema_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                    **)local_280);
        puVar2 = puVar2 + 1;
      } while (puVar2 != local_138.
                         super__Vector_base<jsoncons::jsonschema::uri_wrapper,_std::allocator<jsoncons::jsonschema::uri_wrapper>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
    }
  }
  if (local_50 != &local_40) {
    operator_delete(local_50,local_40._M_allocated_capacity + 1);
  }
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_88);
  if ((local_90 == '\x01') && (local_90 = '\0', (__node_base *)local_120 != local_110)) {
    operator_delete(local_120,(ulong)((long)&(local_110[0]._M_nxt)->_M_nxt + 1));
  }
  std::vector<jsoncons::jsonschema::uri_wrapper,_std::allocator<jsoncons::jsonschema::uri_wrapper>_>
  ::~vector(&local_138);
  if (local_160 != &local_150) {
    operator_delete(local_160,local_150._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_280._144_8_ != local_1e0) {
    operator_delete((void *)local_280._144_8_,(ulong)(local_1e0[0]._M_allocated_capacity + 1));
  }
  return (__uniq_ptr_data<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>,_true,_true>
          )(__uniq_ptr_data<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>,_true,_true>
            )this;
}

Assistant:

schema_validator_ptr_type make_schema_validator(const compilation_context<Json>& context, 
            const Json& sch, jsoncons::span<const std::string> keys, anchor_uri_map_type& anchor_dict) override
        {
            auto new_context = make_compilation_context(context, sch, keys);
            //std::cout << "this->make_cross_draft_schema_validator " << context.get_base_uri().string() << ", " << new_context.get_base_uri().string() << "\n\n";

            schema_validator_ptr_type schema_validator_ptr;

            switch (sch.type())
            {
                case json_type::bool_value:
                {
                    schema_validator_ptr = this->make_boolean_schema(new_context, sch);
                    schema_validator<Json>* p = schema_validator_ptr.get();
                    for (const auto& uri : new_context.uris()) 
                    { 
                        this->insert_schema(uri, p);
                    }          
                    break;
                }
                case json_type::object_value:
                {
                    schema_validator_ptr = make_object_schema_validator(new_context, sch, anchor_dict);
                    schema_validator<Json>* p = schema_validator_ptr.get();
                    for (const auto& uri : new_context.uris()) 
                    { 
                        this->insert_schema(uri, p);
                        /*for (const auto& item : sch.object_range())
                        {
                            if (known_keywords().find(item.key()) == known_keywords().end())
                            {
                                std::cout << "  " << item.key() << "\n";
                                this->insert_unknown_keyword(uri, item.key(), item.value()); // save unknown keywords for later reference
                            }
                        }*/
                    }          
                    break;
                }
                default:
                    JSONCONS_THROW(schema_error(new_context.get_base_uri().string() + ": Invalid JSON-type for a schema, expected: boolean or object"));
                    break;
            }
            
            return schema_validator_ptr;
        }